

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
spdlog::details::make_unique<spdlog::pattern_formatter>(void)

{
  pattern_formatter *this;
  __uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
  in_RDI;
  allocator local_31;
  string local_30;
  
  this = (pattern_formatter *)operator_new(0xe0);
  std::__cxx11::string::string((string *)&local_30,"\n",&local_31);
  pattern_formatter::pattern_formatter(this,local,&local_30);
  *(pattern_formatter **)
   in_RDI.
   super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
   ._M_t.
   super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
   .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl = this;
  std::__cxx11::string::~string((string *)&local_30);
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(tuple<spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>)
           in_RDI.
           super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
           .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&... args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}